

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeTypes(WasmBinaryWriter *this)

{
  pointer pHVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  _Storage<wasm::HeapType,_true> _Var3;
  bool bVar4;
  int32_t start;
  HeapTypeKind HVar5;
  RecGroup RVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  BufferWithRandomAccess *pBVar9;
  Type *pTVar10;
  Struct *__x;
  HeapType type;
  uint uVar11;
  _Bit_pointer puVar12;
  iterator __begin2;
  pointer pHVar13;
  RecGroup unaff_R14;
  Field *field;
  _Storage<wasm::HeapType,_true> field_00;
  byte bVar14;
  long lVar15;
  optional<wasm::HeapType> oVar16;
  reference rVar17;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar18;
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> hasSubtypes;
  RecGroup local_70;
  RecGroup currGroup;
  HeapType type_1;
  _Storage<wasm::HeapType,_true> local_58;
  optional<wasm::HeapType> super;
  ulong local_40;
  HeapType local_38;
  value_type type_2;
  
  pHVar13 = (this->indexedTypes).types.
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar1 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar1 != pHVar13) {
    local_40 = local_40 & 0xffffffff00000000;
    bVar14 = 1;
    for (; pHVar13 != pHVar1; pHVar13 = pHVar13 + 1) {
      local_a8 = (undefined1  [8])pHVar13->id;
      RVar6 = HeapType::getRecGroup((HeapType *)local_a8);
      local_40 = CONCAT44(local_40._4_4_,local_40._0_4_ + (bVar14 | unaff_R14.id != RVar6.id));
      bVar14 = 0;
      unaff_R14 = RVar6;
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_a8,
               (long)(this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_58);
    pHVar1 = (this->indexedTypes).types.
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pHVar13 = (this->indexedTypes).types.
                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                   super__Vector_impl_data._M_start; pHVar13 != pHVar1; pHVar13 = pHVar13 + 1) {
      currGroup.id = pHVar13->id;
      oVar16 = HeapType::getDeclaredSuperType((HeapType *)&currGroup);
      _local_58 = oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._0_9_;
      if (((undefined1  [16])
           oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pmVar7 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&(this->indexedTypes).indices,(key_type *)&local_58);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)*pmVar7);
        *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
      }
    }
    start = startSection<wasm::BinaryConsts::Section>(this,Type);
    BufferWithRandomAccess::operator<<(this->o,local_40._0_4_);
    bVar14 = 0;
    uVar11 = 0;
    while( true ) {
      puVar12 = (_Bit_pointer)(ulong)uVar11;
      pHVar13 = (this->indexedTypes).types.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((_Bit_pointer)
          ((long)(this->indexedTypes).types.
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pHVar13 >> 3) <= puVar12) break;
      local_38.id = pHVar13[(long)puVar12].id;
      hasSubtypes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = puVar12;
      local_70 = HeapType::getRecGroup(&local_38);
      if ((!(bool)(bVar14 & local_40 == local_70.id)) &&
         (sVar8 = RecGroup::size(&local_70), 1 < sVar8)) {
        pBVar9 = BufferWithRandomAccess::operator<<(this->o,'N');
        sVar8 = RecGroup::size(&local_70);
        BufferWithRandomAccess::operator<<(pBVar9,(U32LEB)(uint)sVar8);
      }
      local_40 = local_70.id;
      oVar16 = HeapType::getDeclaredSuperType(&local_38);
      if ((((undefined1  [16])
            oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
           (undefined1  [16])0x0) || (bVar4 = HeapType::isOpen(&local_38), bVar4)) {
        bVar4 = HeapType::isOpen(&local_38);
        BufferWithRandomAccess::operator<<(this->o,bVar4 + 'O');
        if (((undefined1  [16])
             oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x0);
        }
        else {
          BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x1);
          writeHeapType(this,oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,
                        Inexact);
        }
      }
      bVar4 = HeapType::isShared(&local_38);
      if (bVar4) {
        BufferWithRandomAccess::operator<<(this->o,'e');
      }
      oVar16 = HeapType::getDescribedType(&local_38);
      if (((undefined1  [16])
           oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        BufferWithRandomAccess::operator<<(this->o,'L');
        writeHeapType(this,oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,Inexact)
        ;
      }
      oVar16 = HeapType::getDescriptorType(&local_38);
      if (((undefined1  [16])
           oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        BufferWithRandomAccess::operator<<(this->o,'M');
        writeHeapType(this,oVar16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,Inexact)
        ;
      }
      HVar5 = HeapType::getKind(&local_38);
      switch(HVar5) {
      case Basic:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x148);
      case Func:
        BufferWithRandomAccess::operator<<(this->o,'`');
        _local_58 = (Field)HeapType::getSignature(&local_38);
        for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 8) {
          pTVar10 = (Type *)((long)&local_58 + lVar15);
          pBVar9 = this->o;
          sVar8 = wasm::Type::size(pTVar10);
          BufferWithRandomAccess::operator<<(pBVar9,(U32LEB)(uint)sVar8);
          type_1.id = 0;
          currGroup.id = (uintptr_t)pTVar10;
          PVar18 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end(pTVar10);
          for (; PVar2.index = type_1.id, PVar2.parent = (Type *)currGroup.id, PVar18 != PVar2;
              type_1.id = type_1.id + 1) {
            pTVar10 = wasm::Type::Iterator::operator*((Iterator *)&currGroup);
            writeType(this,(Type)pTVar10->id);
          }
        }
        break;
      case Struct:
        BufferWithRandomAccess::operator<<(this->o,'_');
        __x = HeapType::getStruct(&local_38);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&local_58,&__x->fields);
        BufferWithRandomAccess::operator<<
                  (this->o,(U32LEB)(uint)((ulong)((long)super.
                                                  super__Optional_base<wasm::HeapType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<wasm::HeapType>.
                                                  _M_payload - (long)local_58) >> 4));
        _Var3 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload;
        for (field_00 = local_58; field_00 != _Var3;
            field_00 = (_Storage<wasm::HeapType,_true>)((long)field_00 + 0x10)) {
          writeField(this,(Field *)field_00);
        }
        std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                  ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&local_58);
        break;
      case Array:
        BufferWithRandomAccess::operator<<(this->o,'^');
        HeapType::getArray((HeapType *)&local_58);
        writeField(this,(Field *)&local_58);
        break;
      case Cont:
        BufferWithRandomAccess::operator<<(this->o,']');
        type.id = (uintptr_t)HeapType::getContinuation(&local_38);
        writeHeapType(this,type,Inexact);
      }
      uVar11 = (int)hasSubtypes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + 1;
      bVar14 = 1;
    }
    finishSection(this,start);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)local_a8);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeTypes() {
  if (indexedTypes.types.size() == 0) {
    return;
  }
  // Count the number of recursion groups, which is the number of elements in
  // the type section.
  size_t numGroups = 0;
  {
    std::optional<RecGroup> lastGroup;
    for (auto type : indexedTypes.types) {
      auto currGroup = type.getRecGroup();
      numGroups += lastGroup != currGroup;
      lastGroup = currGroup;
    }
  }

  // As a temporary measure, detect which types have subtypes and always use
  // `sub` or `sub final` for these types. The standard says that types without
  // `sub` or `sub final` are final, but we currently treat them as non-final.
  // To avoid unsafe ambiguity, only use the short form for types that it would
  // be safe to treat as final, i.e. types without subtypes.
  std::vector<bool> hasSubtypes(indexedTypes.types.size());
  for (auto type : indexedTypes.types) {
    if (auto super = type.getDeclaredSuperType()) {
      hasSubtypes[indexedTypes.indices[*super]] = true;
    }
  }

  auto start = startSection(BinaryConsts::Section::Type);
  o << U32LEB(numGroups);
  std::optional<RecGroup> lastGroup = std::nullopt;
  for (Index i = 0; i < indexedTypes.types.size(); ++i) {
    auto type = indexedTypes.types[i];
    // Check whether we need to start a new recursion group. Recursion groups of
    // size 1 are implicit, so only emit a group header for larger groups.
    auto currGroup = type.getRecGroup();
    if (lastGroup != currGroup && currGroup.size() > 1) {
      o << uint8_t(BinaryConsts::EncodedType::Rec) << U32LEB(currGroup.size());
    }
    lastGroup = currGroup;
    // Emit the type definition.
    auto super = type.getDeclaredSuperType();
    if (super || type.isOpen()) {
      if (type.isOpen()) {
        o << uint8_t(BinaryConsts::EncodedType::Sub);
      } else {
        o << uint8_t(BinaryConsts::EncodedType::SubFinal);
      }
      if (super) {
        o << U32LEB(1);
        writeHeapType(*super, Inexact);
      } else {
        o << U32LEB(0);
      }
    }
    if (type.isShared()) {
      o << uint8_t(BinaryConsts::EncodedType::Shared);
    }
    if (auto desc = type.getDescribedType()) {
      o << uint8_t(BinaryConsts::EncodedType::Describes);
      writeHeapType(*desc, Inexact);
    }
    if (auto desc = type.getDescriptorType()) {
      o << uint8_t(BinaryConsts::EncodedType::Descriptor);
      writeHeapType(*desc, Inexact);
    }
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        o << uint8_t(BinaryConsts::EncodedType::Func);
        auto sig = type.getSignature();
        for (auto& sigType : {sig.params, sig.results}) {
          o << U32LEB(sigType.size());
          for (const auto& type : sigType) {
            writeType(type);
          }
        }
        break;
      }
      case HeapTypeKind::Struct: {
        o << uint8_t(BinaryConsts::EncodedType::Struct);
        auto fields = type.getStruct().fields;
        o << U32LEB(fields.size());
        for (const auto& field : fields) {
          writeField(field);
        }
        break;
      }
      case HeapTypeKind::Array:
        o << uint8_t(BinaryConsts::EncodedType::Array);
        writeField(type.getArray().element);
        break;
      case HeapTypeKind::Cont:
        o << uint8_t(BinaryConsts::EncodedType::Cont);
        writeHeapType(type.getContinuation().type, Inexact);
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }
  finishSection(start);
}